

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# microtar.c
# Opt level: O1

int mtar_find(mtar_t *tar,char *name,mtar_header_t *h)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  mtar_header_t header;
  mtar_header_t local_110;
  
  sVar3 = strlen(name);
  iVar1 = -9;
  if (sVar3 < 100) {
    tar->remaining_data = 0;
    tar->last_header = 0;
    iVar1 = (*tar->seek)(tar,0);
    tar->pos = 0;
    if (iVar1 == 0) {
      iVar2 = mtar_read_header(tar,&local_110);
      if (iVar2 == 0) {
        do {
          iVar1 = strcmp(local_110.name,name);
          if (iVar1 == 0) {
            if (h == (mtar_header_t *)0x0) {
              return 0;
            }
            memcpy(h,&local_110,0xe0);
            return 0;
          }
          mtar_next(tar);
          iVar2 = mtar_read_header(tar,&local_110);
        } while (iVar2 == 0);
      }
      iVar1 = -8;
      if (iVar2 != -7) {
        iVar1 = iVar2;
      }
    }
  }
  return iVar1;
}

Assistant:

int mtar_find(mtar_t *tar, const char *name, mtar_header_t *h) {
  int err;
  mtar_header_t header;

  if (strlen(name) > MTAR_NAMEMAX)
    return MTAR_ENAMELONG;

  /* Start at beginning */
  err = mtar_rewind(tar);
  if (err) {
    return err;
  }
  /* Iterate all files until we hit an error or find the file */
  while ( (err = mtar_read_header(tar, &header)) == MTAR_ESUCCESS ) {
    if ( !strcmp(header.name, name) ) {
      if (h) {
        *h = header;
      }
      return MTAR_ESUCCESS;
    }
    mtar_next(tar);
  }
  /* Return error */
  if (err == MTAR_ENULLRECORD) {
    err = MTAR_ENOTFOUND;
  }
  return err;
}